

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacProj.cpp
# Opt level: O0

void __thiscall MacProj::check_div_cond(MacProj *this,int level,MultiFab *U_edge)

{
  bool bVar1;
  int iVar2;
  BoxArray *this_00;
  anon_class_512_8_0da7de73 *f;
  int IOProc;
  Real sm;
  Array4<const_double> *vol;
  Array4<const_double> *zarea;
  Array4<const_double> *yarea;
  Array4<const_double> *xarea;
  Array4<double> *uz_e;
  Array4<double> *uy_e;
  Array4<double> *ux_e;
  Array4<double> *cc_divu;
  Box *bx;
  MFIter mfi;
  MultiFab dmac;
  MultiFab *area;
  MultiFab *volume;
  NavierStokesBase *ns_level;
  undefined8 in_stack_fffffffffffff748;
  BoxArray *bxs;
  Amr *in_stack_fffffffffffff750;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff758;
  anon_class_1_0_00000001 *in_stack_fffffffffffff760;
  undefined8 in_stack_fffffffffffff768;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff770;
  FabArrayBase *in_stack_fffffffffffff778;
  ostream *os_;
  Print *in_stack_fffffffffffff780;
  Box *box;
  MFIter *in_stack_fffffffffffff7b0;
  Print *in_stack_fffffffffffff7c0;
  ostream *local_6c0;
  undefined1 local_6b8 [64];
  undefined1 auStack_678 [64];
  undefined1 auStack_638 [64];
  undefined1 auStack_5f8 [64];
  undefined1 auStack_5b8 [64];
  undefined1 auStack_578 [64];
  undefined1 auStack_538 [64];
  undefined1 auStack_4f8 [64];
  undefined1 local_4b8 [64];
  undefined1 *local_478;
  undefined1 local_470 [64];
  undefined1 *local_430;
  undefined1 local_428 [64];
  undefined1 *local_3e8;
  undefined1 local_3e0 [64];
  undefined1 *local_3a0;
  undefined1 local_398 [64];
  undefined1 *local_358;
  undefined1 local_350 [64];
  undefined1 *local_310;
  undefined1 local_308 [64];
  undefined1 *local_2c8;
  undefined1 local_2c0 [64];
  undefined1 *local_280;
  undefined1 local_274 [36];
  MFIter local_250;
  undefined1 local_1e0 [432];
  MultiFab *local_30;
  FabArrayBase *local_28;
  NavierStokesBase *local_20;
  
  local_20 = (NavierStokesBase *)
             amrex::Amr::getLevel
                       (in_stack_fffffffffffff750,(int)((ulong)in_stack_fffffffffffff748 >> 0x20));
  local_28 = (FabArrayBase *)NavierStokesBase::Volume(local_20);
  local_30 = NavierStokesBase::Area(local_20);
  this_00 = amrex::FabArrayBase::boxArray(local_28);
  f = (anon_class_512_8_0da7de73 *)amrex::FabArrayBase::DistributionMap(local_28);
  local_1e0._24_8_ = 0;
  local_1e0._32_8_ = 0;
  local_1e0._8_8_ = 0;
  local_1e0._16_8_ = 0;
  local_1e0._40_8_ = 0;
  box = (Box *)(local_1e0 + 8);
  amrex::MFInfo::MFInfo((MFInfo *)0x84882c);
  local_1e0._0_8_ = 0;
  bxs = (BoxArray *)local_1e0;
  amrex::DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff750);
  amrex::MultiFab::MultiFab
            ((MultiFab *)this_00,bxs,(DistributionMapping *)in_stack_fffffffffffff780,
             (int)((ulong)in_stack_fffffffffffff778 >> 0x20),(int)in_stack_fffffffffffff778,
             (MFInfo *)in_stack_fffffffffffff770,(FabFactory<amrex::FArrayBox> *)box);
  amrex::DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x848888);
  amrex::MFInfo::~MFInfo((MFInfo *)0x848895);
  amrex::TilingIfNotGPU();
  amrex::MFIter::MFIter
            ((MFIter *)in_stack_fffffffffffff780,in_stack_fffffffffffff778,
             SUB81((ulong)in_stack_fffffffffffff770 >> 0x38,0));
  while( true ) {
    bVar1 = amrex::MFIter::isValid(&local_250);
    iVar2 = (int)((ulong)in_stack_fffffffffffff768 >> 0x20);
    if (!bVar1) break;
    amrex::MFIter::tilebox(in_stack_fffffffffffff7b0);
    local_274._28_8_ = local_274;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff758,(MFIter *)in_stack_fffffffffffff750);
    local_280 = local_2c0;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff758,(MFIter *)in_stack_fffffffffffff750);
    local_2c8 = local_308;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff758,(MFIter *)in_stack_fffffffffffff750);
    local_310 = local_350;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff758,(MFIter *)in_stack_fffffffffffff750);
    local_358 = local_398;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff758,(MFIter *)in_stack_fffffffffffff750);
    local_3a0 = local_3e0;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff758,(MFIter *)in_stack_fffffffffffff750);
    local_3e8 = local_428;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff758,(MFIter *)in_stack_fffffffffffff750);
    local_430 = local_470;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff758,(MFIter *)in_stack_fffffffffffff750);
    local_478 = local_4b8;
    in_stack_fffffffffffff780 = (Print *)local_274._28_8_;
    memcpy(local_6b8,local_280,0x3c);
    memcpy(auStack_678,local_2c8,0x3c);
    memcpy(auStack_638,local_310,0x3c);
    memcpy(auStack_5f8,local_358,0x3c);
    memcpy(auStack_5b8,local_3a0,0x3c);
    memcpy(auStack_578,local_3e8,0x3c);
    memcpy(auStack_538,local_430,0x3c);
    memcpy(auStack_4f8,local_478,0x3c);
    amrex::ParallelFor<MacProj::check_div_cond(int,amrex::MultiFab*)const::__0>(box,f);
    amrex::MFIter::operator++(&local_250);
  }
  amrex::MFIter::~MFIter((MFIter *)in_stack_fffffffffffff750);
  os_ = (ostream *)
        amrex::
        ReduceSum<amrex::FArrayBox,MacProj::check_div_cond(int,amrex::MultiFab*)const::__1,void>
                  (in_stack_fffffffffffff770,iVar2,in_stack_fffffffffffff760);
  local_6c0 = os_;
  if (verbose != 0) {
    iVar2 = amrex::ParallelDescriptor::IOProcessorNumber();
    amrex::ParallelDescriptor::ReduceRealSum<double>((double *)&local_6c0,iVar2);
    amrex::OutStream();
    amrex::Print::Print(in_stack_fffffffffffff780,os_);
    amrex::Print::SetPrecision((Print *)in_stack_fffffffffffff750,(int)((ulong)bxs >> 0x20));
    amrex::Print::operator<<((Print *)in_stack_fffffffffffff750,(char (*) [22])bxs);
    amrex::Print::operator<<((Print *)in_stack_fffffffffffff750,(double *)bxs);
    amrex::Print::operator<<((Print *)in_stack_fffffffffffff750,(char *)bxs);
    amrex::Print::~Print(in_stack_fffffffffffff7c0);
  }
  amrex::MultiFab::~MultiFab((MultiFab *)0x848d0d);
  return;
}

Assistant:

void
MacProj::check_div_cond (int      level,
                         MultiFab U_edge[]) const
{
    const NavierStokesBase& ns_level = *(NavierStokesBase*) &(parent->getLevel(level));
    const MultiFab& volume       = ns_level.Volume();
    const MultiFab* area         = ns_level.Area();

    MultiFab dmac(volume.boxArray(),volume.DistributionMap(),1,0);

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(dmac,TilingIfNotGPU());mfi.isValid();++mfi)
    {
        const Box& bx = mfi.tilebox();
        auto const& cc_divu   = dmac.array(mfi);
        D_TERM(auto const& ux_e = U_edge[0].array(mfi);,
               auto const& uy_e = U_edge[1].array(mfi);,
               auto const& uz_e = U_edge[2].array(mfi););
        D_TERM(auto const& xarea  = area[0].array(mfi);,
               auto const& yarea  = area[1].array(mfi);,
               auto const& zarea  = area[2].array(mfi););
        auto const& vol       = volume.array(mfi);

        amrex::ParallelFor(bx, [cc_divu,D_DECL(ux_e,uy_e,uz_e),
                                        D_DECL(xarea,yarea,zarea), vol]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            cc_divu(i,j,k) = D_TERM(  xarea(i+1,j,k)*ux_e(i+1,j,k) - xarea(i,j,k)*ux_e(i,j,k),
                                    + yarea(i,j+1,k)*uy_e(i,j+1,k) - yarea(i,j,k)*uy_e(i,j,k),
                                    + zarea(i,j,k+1)*uz_e(i,j,k+1) - zarea(i,j,k)*uz_e(i,j,k));
            cc_divu(i,j,k) /= vol(i,j,k);
        });
    }

    Real sm = amrex::ReduceSum(dmac, 0, []
    AMREX_GPU_HOST_DEVICE (Box const& bx, Array4<Real const> const& dmac_arr) -> Real
    {
        Real tmp = 0.0;
        AMREX_LOOP_3D(bx, i, j, k,
        {
            tmp += dmac_arr(i,j,k);
        });
        return tmp;
    });

    if (verbose)
    {
        const int IOProc = ParallelDescriptor::IOProcessorNumber();

        ParallelDescriptor::ReduceRealSum(sm,IOProc);

        amrex::Print().SetPrecision(15) << "SUM of DIV(U_edge) = " << sm << '\n';
    }
}